

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterable.h
# Opt level: O0

qsizetype __thiscall QIterable<QMetaAssociation>::size(QIterable<QMetaAssociation> *this)

{
  bool bVar1;
  QMetaContainer *this_00;
  void *i;
  void *in_RDI;
  qsizetype size;
  void *end;
  void *begin;
  void *container;
  void *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  QMetaContainer *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  constIterable((QIterable<QMetaAssociation> *)0x3c277b);
  bVar1 = QMetaContainer::hasSize((QMetaContainer *)((long)in_RDI + 0x10));
  if (bVar1) {
    local_8 = (QMetaContainer *)
              QMetaContainer::size(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    bVar1 = QMetaContainer::hasConstIterator((QMetaContainer *)((long)in_RDI + 0x10));
    if (bVar1) {
      this_00 = (QMetaContainer *)
                QMetaContainer::constBegin(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      i = QMetaContainer::constEnd(this_00,in_stack_ffffffffffffffd8);
      local_8 = (QMetaContainer *)
                QMetaContainer::diffConstIterator(this_00,i,in_stack_ffffffffffffffd0);
      QMetaContainer::destroyConstIterator(local_8,in_RDI);
      QMetaContainer::destroyConstIterator(local_8,in_RDI);
    }
    else {
      local_8 = (QMetaContainer *)0xffffffffffffffff;
    }
  }
  return (qsizetype)local_8;
}

Assistant:

qsizetype size() const
    {
        const void *container = constIterable();
        if (m_metaContainer.hasSize())
            return m_metaContainer.size(container);
        if (!m_metaContainer.hasConstIterator())
            return -1;

        const void *begin = m_metaContainer.constBegin(container);
        const void *end = m_metaContainer.constEnd(container);
        const qsizetype size = m_metaContainer.diffConstIterator(end, begin);
        m_metaContainer.destroyConstIterator(begin);
        m_metaContainer.destroyConstIterator(end);
        return size;
    }